

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoprintf.h
# Opt level: O0

int npf_ftoa_rev(char *buf,npf_format_spec_t *spec,double f)

{
  bool bVar1;
  byte bVar2;
  char cVar3;
  ulong uVar4;
  char local_a8;
  long local_a0;
  char *local_98;
  byte local_8a;
  uint_fast8_t i;
  uint_fast8_t digit;
  npf_double_bin_t bin_f;
  npf_ftoa_exp_t exp_f;
  int_fast8_t shift_f;
  npf_ftoa_dec_t dec_f;
  long lStack_70;
  npf_ftoa_man_t man_f;
  npf_ftoa_exp_t exp_i;
  uint local_60;
  byte local_5b;
  byte local_5a;
  int_fast8_t shift_i;
  npf_ftoa_man_t man_i;
  npf_ftoa_dec_t dec;
  npf_ftoa_dec_t end;
  uint_fast8_t carry;
  npf_ftoa_exp_t exp;
  uint_fast8_t i_1;
  char *dst;
  char *src;
  npf_double_bin_t bin;
  char *ret;
  double f_local;
  npf_format_spec_t *spec_local;
  char *buf_local;
  
  bin = 0;
  for (exp._7_1_ = 0; exp._7_1_ < 8; exp._7_1_ = exp._7_1_ + 1) {
    *(undefined1 *)((long)&src + (ulong)exp._7_1_) = *(undefined1 *)((long)&ret + (ulong)exp._7_1_);
  }
  _man_i = (ulong)src >> 0x34 & 0x7ff;
  src = (char *)((ulong)src & 0xfffffffffffff);
  if (_man_i == 0x7ff) {
    if (src == (char *)0x0) {
      local_98 = "FNI";
    }
    else {
      local_98 = "NAN";
    }
    bin = (npf_double_bin_t)local_98;
  }
  else if (spec->prec < 0x16) {
    if (_man_i == 0) {
      _man_i = 1;
    }
    else {
      src = (char *)((ulong)src | 0x10000000000000);
    }
    _man_i = _man_i - 0x3ff;
    shift_i = '\0';
    bVar2 = (byte)spec->prec;
    if ((bVar2 != 0) || (local_5b = 0, spec->alt_form != '\0')) {
      local_5b = bVar2 + 1;
      buf[bVar2] = '.';
    }
    if ((long)_man_i < 0) {
      local_60 = 0;
    }
    else {
      local_a0 = _man_i;
      if (0x1f < (long)_man_i) {
        local_a0 = 0x1f;
      }
      lStack_70 = _man_i - (long)(char)local_a0;
      cVar3 = -(char)local_a0;
      bVar2 = cVar3 + 0x34;
      local_60 = (uint)((ulong)src >> (bVar2 & 0x3f));
      if (lStack_70 != 0) {
        if (bVar2 != 0) {
          shift_i = (byte)((ulong)src >> (cVar3 + 0x33U & 0x3f)) & 1;
        }
        _man_i = 0x34;
      }
      for (; lStack_70 != 0; lStack_70 = lStack_70 + -1) {
        if ((local_60 & 0x80000000) == 0) {
          local_60 = local_60 << 1 | (uint)(byte)shift_i;
          shift_i = '\0';
        }
        else {
          if (0x16 < local_5b) goto LAB_0013acd4;
          buf[local_5b] = '0';
          shift_i = 2 < local_60 % 5 + (uint)(byte)shift_i;
          local_60 = local_60 / 5;
          local_5b = local_5b + 1;
        }
      }
    }
    local_5a = local_5b;
    do {
      if (0x16 < local_5a) goto LAB_0013acd4;
      bVar2 = local_5a + 1;
      buf[local_5a] = (char)((ulong)local_60 % 10) + '0';
      local_60 = local_60 / 10;
      local_5a = bVar2;
    } while (local_60 != 0);
    exp_f._3_1_ = (byte)spec->prec;
    if ((long)_man_i < 0x34) {
      if ((long)_man_i < 0) {
        local_a8 = -1;
      }
      else {
        local_a8 = (char)_man_i;
      }
      uVar4 = (long)src << (local_a8 + 0xcU & 0x3f);
      exp_f._4_4_ = (uint)(uVar4 >> 0x20);
      shift_i = (byte)(uVar4 >> 0x1f) & 1;
      bVar1 = false;
      for (bin_f = _man_i - (long)local_a8; exp_f._3_1_ != 0 && (long)bin_f < 4; bin_f = bin_f + 1)
      {
        if ((0x33333332 < exp_f._4_4_) || (bVar1)) {
          shift_i = (byte)exp_f._4_4_ & 1;
          exp_f._4_4_ = exp_f._4_4_ >> 1;
        }
        else {
          exp_f._4_4_ = exp_f._4_4_ * 5;
          if (shift_i != '\0') {
            exp_f._4_4_ = exp_f._4_4_ + 3;
            shift_i = '\0';
          }
          if ((long)bin_f < 0) {
            exp_f._3_1_ = exp_f._3_1_ - 1;
            buf[exp_f._3_1_] = '0';
          }
          else {
            bVar1 = true;
          }
        }
      }
      exp_f._4_4_ = exp_f._4_4_ + (byte)shift_i;
      shift_i = -1 < (long)bin_f;
      local_5b = 0;
    }
    else {
      exp_f._4_4_ = 0;
    }
    if (exp_f._3_1_ != 0) {
      while( true ) {
        exp_f._3_1_ = exp_f._3_1_ - 1;
        buf[exp_f._3_1_] = (byte)(exp_f._4_4_ >> 0x1c) + 0x30;
        if (exp_f._3_1_ == 0) break;
        exp_f._4_4_ = (exp_f._4_4_ & 0xfffffff) * 10;
      }
      exp_f._4_4_ = (exp_f._4_4_ & 0xfffffff) << 4;
    }
    if ((long)_man_i < 0x34) {
      shift_i = shift_i & (byte)(exp_f._4_4_ >> 0x1f);
    }
    while (shift_i != '\0') {
      if (0x16 < local_5b) goto LAB_0013acd4;
      if (local_5a <= local_5b) {
        buf[local_5a] = '0';
        local_5a = local_5a + 1;
      }
      if (buf[local_5b] != '.') {
        shift_i = buf[local_5b] == '9';
        if ((bool)shift_i) {
          cVar3 = '0';
        }
        else {
          cVar3 = buf[local_5b] + '\x01';
        }
        buf[local_5b] = cVar3;
      }
      local_5b = local_5b + 1;
    }
    goto LAB_0013ad41;
  }
LAB_0013acd4:
  if (bin == 0) {
    bin = (npf_double_bin_t)anon_var_dwarf_3fe6;
  }
  for (local_8a = 0; local_5a = local_8a, *(char *)(bin + local_8a) != '\0'; local_8a = local_8a + 1
      ) {
    buf[local_8a] = *(char *)(bin + local_8a) + spec->case_adjust;
  }
LAB_0013ad41:
  buf_local._4_4_ = (uint)local_5a;
  return buf_local._4_4_;
}

Assistant:

static int npf_ftoa_rev(char *buf, npf_format_spec_t const *spec, double f) {
  char const *ret = NULL;
  npf_double_bin_t bin; { // Union-cast is UB pre-C11, compiler optimizes byte-copy loop.
    char const *src = (char const *)&f;
    char *dst = (char *)&bin;
    for (uint_fast8_t i = 0; i < sizeof(f); ++i) { dst[i] = src[i]; }
  }

  // Unsigned -> signed int casting is IB and can raise a signal but generally doesn't.
  npf_ftoa_exp_t exp =
    (npf_ftoa_exp_t)((npf_ftoa_exp_t)(bin >> NPF_DOUBLE_MAN_BITS) & NPF_DOUBLE_EXP_MASK);

  bin &= ((npf_double_bin_t)0x1 << NPF_DOUBLE_MAN_BITS) - 1;
  if (exp == (npf_ftoa_exp_t)NPF_DOUBLE_EXP_MASK) { // special value
    ret = (bin) ? "NAN" : "FNI";
    goto exit;
  }
  if (spec->prec > (NANOPRINTF_CONVERSION_BUFFER_SIZE - 2)) { goto exit; }
  if (exp) { // normal number
    bin |= (npf_double_bin_t)0x1 << NPF_DOUBLE_MAN_BITS;
  } else { // subnormal number
    ++exp;
  }
  exp = (npf_ftoa_exp_t)(exp - NPF_DOUBLE_EXP_BIAS);

  uint_fast8_t carry; carry = 0;
  npf_ftoa_dec_t end, dec; dec = (npf_ftoa_dec_t)spec->prec;
  if (dec || spec->alt_form) {
    buf[dec++] = '.';
  }

  { // Integer part
    npf_ftoa_man_t man_i;

    if (exp >= 0) {
      int_fast8_t shift_i =
        (int_fast8_t)((exp > NPF_FTOA_SHIFT_BITS) ? (int)NPF_FTOA_SHIFT_BITS : exp);
      npf_ftoa_exp_t exp_i = (npf_ftoa_exp_t)(exp - shift_i);
      shift_i = (int_fast8_t)(NPF_DOUBLE_MAN_BITS - shift_i);
      man_i = (npf_ftoa_man_t)(bin >> shift_i);

      if (exp_i) {
        if (shift_i) {
          carry = (bin >> (shift_i - 1)) & 0x1;
        }
        exp = NPF_DOUBLE_MAN_BITS; // invalidate the fraction part
      }

      // Scale the exponent from base-2 to base-10.
      for (; exp_i; --exp_i) {
        if (!(man_i & ((npf_ftoa_man_t)0x1 << (NPF_FTOA_MAN_BITS - 1)))) {
          man_i = (npf_ftoa_man_t)(man_i << 1);
          man_i = (npf_ftoa_man_t)(man_i | carry); carry = 0;
        } else {
          if (dec >= NANOPRINTF_CONVERSION_BUFFER_SIZE) { goto exit; }
          buf[dec++] = '0';
          carry = (((uint_fast8_t)(man_i % 5) + carry) > 2);
          man_i /= 5;
        }
      }
    } else {
      man_i = 0;
    }
    end = dec;

    do { // Print the integer
      if (end >= NANOPRINTF_CONVERSION_BUFFER_SIZE) { goto exit; }
      buf[end++] = (char)('0' + (char)(man_i % 10));
      man_i /= 10;
    } while (man_i);
  }

  { // Fraction part
    npf_ftoa_man_t man_f;
    npf_ftoa_dec_t dec_f = (npf_ftoa_dec_t)spec->prec;

    if (exp < NPF_DOUBLE_MAN_BITS) {
      int_fast8_t shift_f = (int_fast8_t)((exp < 0) ? -1 : exp);
      npf_ftoa_exp_t exp_f = (npf_ftoa_exp_t)(exp - shift_f);
      npf_double_bin_t bin_f =
        bin << ((NPF_DOUBLE_BIN_BITS - NPF_DOUBLE_MAN_BITS) + shift_f);

      // This if-else statement can be completely optimized at compile time.
      if (NPF_DOUBLE_BIN_BITS > NPF_FTOA_MAN_BITS) {
        man_f = (npf_ftoa_man_t)(bin_f >> ((unsigned)(NPF_DOUBLE_BIN_BITS -
                                                      NPF_FTOA_MAN_BITS) %
                                           NPF_DOUBLE_BIN_BITS));
        carry = (uint_fast8_t)((bin_f >> ((unsigned)(NPF_DOUBLE_BIN_BITS -
                                                     NPF_FTOA_MAN_BITS - 1) %
                                          NPF_DOUBLE_BIN_BITS)) & 0x1);
      } else {
        man_f = (npf_ftoa_man_t)((npf_ftoa_man_t)bin_f
                                 << ((unsigned)(NPF_FTOA_MAN_BITS -
                                                NPF_DOUBLE_BIN_BITS) % NPF_FTOA_MAN_BITS));
        carry = 0;
      }

      // Scale the exponent from base-2 to base-10 and prepare the first digit.
      for (uint_fast8_t digit = 0; dec_f && (exp_f < 4); ++exp_f) {
        if ((man_f > ((npf_ftoa_man_t)-4 / 5)) || digit) {
          carry = (uint_fast8_t)(man_f & 0x1);
          man_f = (npf_ftoa_man_t)(man_f >> 1);
        } else {
          man_f = (npf_ftoa_man_t)(man_f * 5);
          if (carry) { man_f = (npf_ftoa_man_t)(man_f + 3); carry = 0; }
          if (exp_f < 0) {
            buf[--dec_f] = '0';
          } else {
            ++digit;
          }
        }
      }
      man_f = (npf_ftoa_man_t)(man_f + carry);
      carry = (exp_f >= 0);
      dec = 0;
    } else {
      man_f = 0;
    }

    if (dec_f) {
      // Print the fraction
      for (;;) {
        buf[--dec_f] = (char)('0' + (char)(man_f >> (NPF_FTOA_MAN_BITS - 4)));
        man_f = (npf_ftoa_man_t)(man_f & ~((npf_ftoa_man_t)0xF << (NPF_FTOA_MAN_BITS - 4)));
        if (!dec_f) { break; }
        man_f = (npf_ftoa_man_t)(man_f * 10);
      }
      man_f = (npf_ftoa_man_t)(man_f << 4);
    }
    if (exp < NPF_DOUBLE_MAN_BITS) {
      carry &= (uint_fast8_t)(man_f >> (NPF_FTOA_MAN_BITS - 1));
    }
  }

  // Round the number
  for (; carry; ++dec) {
    if (dec >= NANOPRINTF_CONVERSION_BUFFER_SIZE) { goto exit; }
    if (dec >= end) { buf[end++] = '0'; }
    if (buf[dec] == '.') { continue; }
    carry = (buf[dec] == '9');
    buf[dec] = (char)(carry ? '0' : (buf[dec] + 1));
  }

  return (int)end;
exit:
  if (!ret) { ret = "RRE"; }
  uint_fast8_t i;
  for (i = 0; ret[i]; ++i) { buf[i] = (char)(ret[i] + spec->case_adjust); }
  return (int)i;
}